

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

void Sfm_LibTest(void)

{
  void *pvVar1;
  Sfm_Lib_t *p_00;
  int fVerbose;
  Sfm_Lib_t *p;
  
  pvVar1 = Abc_FrameReadLibGen();
  if (pvVar1 == (void *)0x0) {
    printf("There is no current library.\n");
  }
  else {
    p_00 = Sfm_LibPrepare(7,1,1,1,1);
    Sfm_LibPrint(p_00);
    Sfm_LibStop(p_00);
  }
  return;
}

Assistant:

void Sfm_LibTest()
{
    Sfm_Lib_t * p;
    int fVerbose = 1;
    if ( Abc_FrameReadLibGen() == NULL )
    {
        printf( "There is no current library.\n" );
        return;
    }
    p = Sfm_LibPrepare( 7, 1, 1, 1, fVerbose );
    if ( fVerbose )
        Sfm_LibPrint( p );
    Sfm_LibStop( p );
}